

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bits * __thiscall
lan::db::find_rec(db *this,string *address,db_bit_type type,db_bit_type final_type,db_bit *ref)

{
  pointer pcVar1;
  db_bit *pdVar2;
  db_bits *pdVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string string;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  find__pop_address(&local_b0,(db *)address,address);
  if (address->_M_string_length == 0) {
    paVar5 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    pdVar3 = find_any(this,&local_50,final_type,ref);
    _Var4._M_p = local_50._M_dataplus._M_p;
LAB_0010d905:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
    }
  }
  else {
    if (local_b0._M_string_length != 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      pdVar2 = find_any(this,&local_90,type,ref);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pdVar2 != (db_bit *)0x0) {
        paVar5 = &local_70.field_2;
        pcVar1 = (address->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + address->_M_string_length);
        pdVar3 = find_rec(this,&local_70,type,final_type,pdVar2->lin);
        _Var4._M_p = local_70._M_dataplus._M_p;
        goto LAB_0010d905;
      }
    }
    pdVar3 = (db_bits *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return pdVar3;
}

Assistant:

lan::db_bits * db::find_rec(std::string address, lan::db_bit_type const type, lan::db_bit_type const final_type, lan::db_bit * ref){
            std::string string = find__pop_address(address);
            if(address.empty()) {
                return find_any(string, final_type, ref);
            } else if(not string.empty()) {
                if((ref = find_any(string, type, ref))){
                    return find_rec(address, type, final_type, ref->lin);
                }
            } return nullptr;
        }